

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Reference<std::allocator<absl::LogSink_*>_> __thiscall
absl::inlined_vector_internal::Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>>::
EmplaceBack<absl::LogSink*const&>
          (Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *this,LogSink **args)

{
  CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**> CVar1;
  Pointer<std::allocator<absl::LogSink_*>_> ppLVar2;
  ulong uVar3;
  Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> *pSVar4;
  ulong uVar5;
  SizeType<std::allocator<absl::LogSink_*>_> SVar6;
  bool bVar7;
  AllocationTransaction<std::allocator<absl::LogSink_*>_> AStack_48;
  
  uVar5 = *(ulong *)this;
  if ((uVar5 & 1) == 0) {
    uVar3 = 0x10;
  }
  else {
    uVar3 = *(ulong *)(this + 0x10);
  }
  if (uVar5 >> 1 != uVar3) {
    if ((uVar5 & 1) == 0) {
      pSVar4 = this + 8;
    }
    else {
      pSVar4 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
    }
    *(ValueType<std::allocator<absl::LogSink_*>_> *)(pSVar4 + (uVar5 >> 1) * 8) = *args;
    *(ulong *)this = uVar5 + 2;
    return (Reference<std::allocator<absl::LogSink_*>_>)(pSVar4 + (uVar5 >> 1) * 8);
  }
  uVar5 = *(ulong *)this >> 1;
  bVar7 = (*(ulong *)this & 1) != 0;
  pSVar4 = this + 8;
  if (bVar7) {
    pSVar4 = *(Storage<absl::LogSink*,16ul,std::allocator<absl::LogSink*>> **)(this + 8);
  }
  AStack_48.allocator_data_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::LogSink_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::LogSink_**,_1UL,_false>)0x0;
  AStack_48.capacity_ = 0;
  SVar6 = 0x20;
  if (bVar7) {
    SVar6 = *(long *)(this + 0x10) * 2;
  }
  ppLVar2 = AllocationTransaction<std::allocator<absl::LogSink_*>_>::Allocate(&AStack_48,SVar6);
  ppLVar2[uVar5] = *args;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined8 *)
     ((long)AStack_48.allocator_data_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<absl::LogSink_**,_1UL,_false>.value + uVar3 * 8) =
         *(undefined8 *)(pSVar4 + uVar3 * 8);
  }
  Storage<absl::LogSink_*,_16UL,_std::allocator<absl::LogSink_*>_>::DeallocateIfAllocated
            ((Storage<absl::LogSink_*,_16UL,_std::allocator<absl::LogSink_*>_> *)this);
  SVar6 = AStack_48.capacity_;
  CVar1.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::LogSink_**,_1UL,_false>.value =
       AStack_48.allocator_data_.
       super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::LogSink_**,_1UL,_false>.value;
  AStack_48.allocator_data_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::LogSink_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::LogSink_**,_1UL,_false>)0x0;
  AStack_48.capacity_ = 0;
  *(CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    *)(this + 8) =
       CVar1.
       super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_absl::LogSink_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::LogSink_**,_1UL,_false>.value;
  *(SizeType<std::allocator<absl::LogSink_*>_> *)(this + 0x10) = SVar6;
  *(ulong *)this = (*(ulong *)this | 1) + 2;
  AllocationTransaction<std::allocator<absl::LogSink_*>_>::~AllocationTransaction(&AStack_48);
  return ppLVar2 + uVar5;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }